

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall
kj::anon_unknown_8::DiskHandle::tryCommitReplacement
          (DiskHandle *this,StringPtr toPath,int fromDirFd,StringPtr fromPath,WriteMode mode,
          int *errorReason)

{
  StringPtr toPath_00;
  StringPtr fromPath_00;
  PathPtr finalName;
  Iface *pIVar1;
  char cVar2;
  String *pSVar3;
  bool bVar4;
  uint code;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  Path *this_00;
  char *__old;
  char *pcVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  stat *__new;
  char *ptrCopy;
  undefined8 uVar13;
  StringPtr path;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr toPath_local;
  StringPtr fromPath_local;
  Function<int_(kj::StringPtr)> local_138;
  Fault f_4;
  anon_union_24_1_a8c68091_for_NullableValue<kj::String>_2 aStack_120;
  String away;
  Path toPathParsed;
  Fault f_7;
  Fault f;
  uint local_a8;
  
  uVar11 = fromPath.content.size_;
  __old = fromPath.content.ptr;
  toPath_local.content.size_ = toPath.content.size_;
  pcVar10 = toPath.content.ptr;
  toPath_local.content.ptr = pcVar10;
  fromPath_local.content.ptr = __old;
  fromPath_local.content.size_ = uVar11;
  if ((mode & CREATE) == 0) {
    if ((mode & MODIFY) == 0) {
      return false;
    }
LAB_0021a727:
    do {
      uVar8 = (ulong)(uint)(this->fd).fd;
      lVar7 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,uVar8,pcVar10,2);
      if (-1 < lVar7) goto LAB_0021a7db;
      code = _::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if (code == 0) {
LAB_0021a7db:
      path.content.size_ = uVar8;
      path.content.ptr = (char *)uVar11;
      rmrf((anon_unknown_8 *)(ulong)(uint)fromDirFd,(int)fromPath.content.ptr,path);
      return true;
    }
    if (code == 0x26) {
      if ((mode & CREATE) == 0) {
        do {
          iVar5 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
          if (-1 < iVar5) goto LAB_0021a9dc;
          iVar5 = _::Debug::getOsErrorNumber(false);
        } while (iVar5 == -1);
        if (iVar5 == 0) {
LAB_0021a9dc:
          toPath_00.content.size_ = toPath_local.content.size_;
          toPath_00.content.ptr = toPath_local.content.ptr;
          fromPath_00.content.size_ = fromPath_local.content.size_;
          fromPath_00.content.ptr = fromPath_local.content.ptr;
          bVar4 = tryCommitReplacement
                            (this,toPath_00,fromDirFd,fromPath_00,MODIFY|CREATE,errorReason);
          return bVar4;
        }
        if (iVar5 == 2) {
          return false;
        }
        if (iVar5 == 0x14) {
          return false;
        }
        iVar6 = 0x4cb;
LAB_0021a86f:
        this_00 = (Path *)&f_4;
        _::Debug::Fault::Fault<int,kj::StringPtr&>
                  (&f_4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,iVar6,iVar5,"fstatat(fd, toPath)","toPath",&toPath_local);
        goto LAB_0021aa43;
      }
      do {
        sVar9 = 0x100;
        iVar5 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
        if (-1 < iVar5) goto LAB_0021a8a8;
        iVar5 = _::Debug::getOsErrorNumber(false);
      } while (iVar5 == -1);
      if (iVar5 != 0) {
        this_00 = &toPathParsed;
        toPathParsed.parts.ptr = (String *)0x0;
        f_4.exception = (Exception *)0x0;
        _::Debug::Fault::init
                  ((Fault *)this_00,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        goto LAB_0021aa43;
      }
LAB_0021a8a8:
      path_00.content.size_ = sVar9;
      path_00.content.ptr = (char *)toPath_local.content.size_;
      Path::parse(&toPathParsed,(Path *)toPath_local.content.ptr,path_00);
      uVar12 = toPathParsed.parts.size_;
      finalName.parts.size_ = toPathParsed.parts.size_;
      finalName.parts.ptr = toPathParsed.parts.ptr;
      local_138.impl.ptr = (Iface *)operator_new(0x18);
      (local_138.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00280708;
      local_138.impl.ptr[1]._vptr_Iface = (_func_int **)&f;
      local_138.impl.ptr[2]._vptr_Iface = (_func_int **)this;
      local_138.impl.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryCommitReplacement(kj::StringPtr,int,kj::StringPtr,kj::WriteMode,int*)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      createNamedTemporary((Maybe<kj::String> *)&f_4,this,finalName,CREATE,&local_138);
      pIVar1 = local_138.impl.ptr;
      cVar2 = (char)f_4.exception;
      uVar13 = (stat *)&f;
      if ((char)f_4.exception == '\x01') {
        uVar12 = aStack_120.value.content.disposer;
        uVar11 = aStack_120.value.content.size_;
        uVar13 = aStack_120.value.content.ptr;
      }
      if (local_138.impl.ptr != (Iface *)0x0) {
        local_138.impl.ptr = (Iface *)0x0;
        (**(local_138.impl.disposer)->_vptr_Disposer)
                  (local_138.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      if (cVar2 == '\0') {
        bVar4 = false;
        goto LAB_0021ac8e;
      }
      __new = (stat *)0x2214ff;
      if ((ArrayDisposer *)uVar11 != (ArrayDisposer *)0x0) {
        __new = (stat *)uVar13;
      }
      do {
        iVar5 = (this->fd).fd;
        iVar5 = renameat(iVar5,toPath_local.content.ptr,iVar5,(char *)__new);
        if (-1 < iVar5) goto LAB_0021aad9;
        iVar5 = _::Debug::getOsErrorNumber(false);
      } while (iVar5 == -1);
      if (iVar5 == 0) {
LAB_0021aad9:
        do {
          pcVar10 = toPath_local.content.ptr;
          iVar5 = renameat(fromDirFd,fromPath_local.content.ptr,(this->fd).fd,
                           toPath_local.content.ptr);
          if (-1 < iVar5) goto LAB_0021ab03;
          iVar5 = _::Debug::getOsErrorNumber(false);
        } while (iVar5 == -1);
        if (iVar5 != 0) {
          do {
            iVar6 = (this->fd).fd;
            iVar6 = renameat(iVar6,(char *)__new,iVar6,toPath_local.content.ptr);
            if (-1 < iVar6) break;
            iVar6 = _::Debug::getOsErrorNumber(false);
          } while (iVar6 == -1);
          if (errorReason == (int *)0x0) {
            _::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
                      (&f_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x4aa,iVar5,"rename(fromPath, toPath)","fromPath, toPath",&fromPath_local,
                       &toPath_local);
            _::Debug::Fault::~Fault(&f_4);
          }
          else {
            *errorReason = iVar5;
          }
          goto LAB_0021ac61;
        }
LAB_0021ab03:
        bVar4 = true;
        path_01.content.size_ = (size_t)pcVar10;
        path_01.content.ptr =
             (char *)((long)&((ArrayDisposer *)uVar11)->_vptr_ArrayDisposer +
                     (ulong)((ArrayDisposer *)uVar11 == (ArrayDisposer *)0x0));
        rmrf((anon_unknown_8 *)(ulong)(uint)(this->fd).fd,(int)__new,path_01);
      }
      else {
        f_7.exception = (Exception *)0x0;
        f_4.exception = (Exception *)0x0;
        _::Debug::Fault::init
                  (&f_7,(EVP_PKEY_CTX *)
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        unlinkat((this->fd).fd,(char *)__new,(uint)((local_a8 & 0xf000) == 0x4000) << 9);
        _::Debug::Fault::~Fault(&f_7);
LAB_0021ac61:
        bVar4 = false;
      }
      if ((stat *)uVar13 != (stat *)0x0) {
        (**((ArrayDisposer *)uVar12)->_vptr_ArrayDisposer)(uVar12,uVar13,1,uVar11,uVar11,0);
      }
LAB_0021ac8e:
      sVar9 = toPathParsed.parts.size_;
      pSVar3 = toPathParsed.parts.ptr;
      if (toPathParsed.parts.ptr != (String *)0x0) {
        toPathParsed.parts.ptr = (String *)0x0;
        toPathParsed.parts.size_ = 0;
        (**(toPathParsed.parts.disposer)->_vptr_ArrayDisposer)
                  (toPathParsed.parts.disposer,pSVar3,0x18,sVar9,sVar9,
                   ArrayDisposer::Dispose_<kj::String,_false>::destruct);
        return bVar4;
      }
      return bVar4;
    }
    if (code == 2) {
      if ((mode & CREATE) == 0) {
        return false;
      }
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[120],kj::StringPtr&,kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,1099,FAILED,(char *)0x0,
                 "\"rename(tmp, path) claimed path exists but \" \"renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?\", fromPath, toPath"
                 ,(char (*) [120])
                  "rename(tmp, path) claimed path exists but renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?"
                 ,&fromPath_local,&toPath_local);
      _::Debug::Fault::~Fault(&f);
      return false;
    }
    if (errorReason != (int *)0x0) {
LAB_0021a9d8:
      *errorReason = code;
      return false;
    }
    pcVar10 = "renameat2(fromPath, toPath, EXCHANGE)";
    iVar5 = 0x452;
  }
  else if ((mode & MODIFY) == 0) {
    do {
      lVar7 = syscall(0x13c,(ulong)(uint)fromDirFd,__old,(ulong)(uint)(this->fd).fd,pcVar10,1);
      if (-1 < lVar7) {
        return true;
      }
      code = _::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if (code == 0) {
      return true;
    }
    if (code == 0x11) {
      return false;
    }
    if (code == 0x26) {
      if ((mode & CREATE) == 0) {
        return false;
      }
      do {
        iVar5 = fstatat((this->fd).fd,toPath_local.content.ptr,(stat *)&f,0x100);
        if (-1 < iVar5) {
          return false;
        }
        iVar5 = _::Debug::getOsErrorNumber(false);
      } while (iVar5 == -1);
      if (iVar5 == 0) {
        return false;
      }
      if ((iVar5 == 2) || (iVar5 == 0x14)) goto LAB_0021a9dc;
      iVar6 = 0x4c0;
      goto LAB_0021a86f;
    }
    if (errorReason != (int *)0x0) goto LAB_0021a9d8;
    pcVar10 = "renameat2(fromPath, toPath, NOREPLACE)";
    iVar5 = 0x467;
  }
  else {
    do {
      iVar5 = renameat(fromDirFd,__old,(this->fd).fd,pcVar10);
      if (-1 < iVar5) {
        return true;
      }
      code = _::Debug::getOsErrorNumber(false);
    } while (code == 0xffffffff);
    if (code < 0x28) {
      if ((0x8000320000U >> ((ulong)code & 0x3f) & 1) != 0) goto LAB_0021a727;
      if ((ulong)code == 0) {
        return true;
      }
    }
    if (errorReason != (int *)0x0) goto LAB_0021a9d8;
    pcVar10 = "rename(fromPath, toPath)";
    iVar5 = 0x42e;
  }
  this_00 = (Path *)&f;
  _::Debug::Fault::Fault<int,kj::StringPtr&,kj::StringPtr&>
            ((Fault *)this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,iVar5,code,pcVar10,"fromPath, toPath",&fromPath_local,&toPath_local);
LAB_0021aa43:
  _::Debug::Fault::~Fault((Fault *)this_00);
  return false;
}

Assistant:

bool tryCommitReplacement(StringPtr toPath, int fromDirFd, StringPtr fromPath, WriteMode mode,
                            int* errorReason = nullptr) const {
    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // Always clobber. Try it.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr())) {
        case EISDIR:
        case ENOTDIR:
        case ENOTEMPTY:
        case EEXIST:
          // Failed because target exists and due to the various weird quirks of rename(), it
          // can't remove it for us. On Linux we can try an exchange instead. On others we have
          // to move the target out of the way.
          break;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) { return false; }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }

#if __linux__ && defined(RENAME_EXCHANGE)
    // Try to use Linux's renameat2() to atomically check preconditions and apply.

    if (has(mode, WriteMode::MODIFY)) {
      // Use an exchange to implement modification.
      //
      // We reach this branch when performing a MODIFY-only, or when performing a CREATE | MODIFY
      // in which we determined above that there's a node of a different type blocking the
      // exchange.

      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_EXCHANGE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case ENOENT:
          // Presumably because the target path doesn't exist.
          if (has(mode, WriteMode::CREATE)) {
            KJ_FAIL_ASSERT("rename(tmp, path) claimed path exists but "
                "renameat2(fromPath, toPath, EXCAHNGE) said it doest; concurrent modification?",
                fromPath, toPath) { return false; }
          } else {
            // Assume target doesn't exist.
            return false;
          }
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, EXCHANGE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        // Successful swap! Delete swapped-out content.
        rmrf(fromDirFd, fromPath);
        return true;
      }
    } else if (has(mode, WriteMode::CREATE)) {
      KJ_SYSCALL_HANDLE_ERRORS(syscall(SYS_renameat2,
          fromDirFd, fromPath.cStr(), fd.get(), toPath.cStr(), RENAME_NOREPLACE)) {
        case ENOSYS:
          break;  // fall back to traditional means
        case EEXIST:
          return false;
        default:
          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("renameat2(fromPath, toPath, NOREPLACE)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      } else {
        return true;
      }
    }
#endif

    // We're unable to do what we wanted atomically. :(

    if (has(mode, WriteMode::CREATE) && has(mode, WriteMode::MODIFY)) {
      // We failed to atomically delete the target previously. So now we need to do two calls in
      // rapid succession to move the old file away then move the new one into place.

      // Find out what kind of file exists at the target path.
      struct stat stats;
      KJ_SYSCALL(fstatat(fd, toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) { return false; }

      // Create a temporary location to move the existing object to. Note that rename() allows a
      // non-directory to replace a non-directory, and allows a directory to replace an empty
      // directory. So we have to create the right type.
      Path toPathParsed = Path::parse(toPath);
      String away;
      KJ_IF_MAYBE(awayPath, createNamedTemporary(toPathParsed, WriteMode::CREATE,
          [&](StringPtr candidatePath) {
        if (S_ISDIR(stats.st_mode)) {
          return mkdirat(fd, candidatePath.cStr(), 0700);
        } else {
#if __APPLE__
          // No mknodat() on OSX, gotta open() a file, ugh.
          int newFd = openat(fd, candidatePath.cStr(),
                             O_RDWR | O_CREAT | O_EXCL | MAYBE_O_CLOEXEC, 0700);
          if (newFd >= 0) close(newFd);
          return newFd;
#else
          return mknodat(fd, candidatePath.cStr(), S_IFREG | 0600, dev_t());
#endif
        }
      })) {
        away = kj::mv(*awayPath);
      } else {
        // Already threw.
        return false;
      }

      // OK, now move the target object to replace the thing we just created.
      KJ_SYSCALL(renameat(fd, toPath.cStr(), fd, away.cStr())) {
        // Something went wrong. Remove the thing we just created.
        unlinkat(fd, away.cStr(), S_ISDIR(stats.st_mode) ? AT_REMOVEDIR : 0);
        return false;
      }

      // Now move the source object to the target location.
      KJ_SYSCALL_HANDLE_ERRORS(renameat(fromDirFd, fromPath.cStr(), fd, toPath.cStr())) {
        default:
          // Try to put things back where they were. If this fails, though, then we have little
          // choice but to leave things broken.
          KJ_SYSCALL_HANDLE_ERRORS(renameat(fd, away.cStr(), fd, toPath.cStr())) {
            default: break;
          }

          if (errorReason == nullptr) {
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
          } else {
            *errorReason = error;
            return false;
          }
      }

      // OK, success. Delete the old content.
      rmrf(fd, away);
      return true;
    } else {
      // Only one of CREATE or MODIFY is specified, so we need to verify non-atomically that the
      // corresponding precondition (must-not-exist or must-exist, respectively) is held.
      if (has(mode, WriteMode::CREATE)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            break;  // doesn't exist; continue
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          return false;  // already exists; fail
        }
      } else if (has(mode, WriteMode::MODIFY)) {
        struct stat stats;
        KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd.get(), toPath.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
          case ENOENT:
          case ENOTDIR:
            return false;  // doesn't exist; fail
          default:
            KJ_FAIL_SYSCALL("fstatat(fd, toPath)", error, toPath) { return false; }
        } else {
          // already exists; continue
        }
      } else {
        // Neither CREATE nor MODIFY.
        return false;
      }

      // Start over in create-and-modify mode.
      return tryCommitReplacement(toPath, fromDirFd, fromPath,
                                  WriteMode::CREATE | WriteMode::MODIFY,
                                  errorReason);
    }
  }